

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O3

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::StartObject(PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this)

{
  char *pcVar1;
  
  PrettyPrefix(this,kObjectType);
  pcVar1 = (this->
           super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  if ((long)(this->
            super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            ).level_stack_.stackEnd_ - (long)pcVar1 < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::Writer<rapidjson::BasicOStreamWrapper<std::ostream>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
              (&(this->
                super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                ).level_stack_,1);
    pcVar1 = (this->
             super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             ).level_stack_.stackTop_;
  }
  (this->
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ).level_stack_.stackTop_ = pcVar1 + 0x10;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  std::ostream::put((char)((this->
                           super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                           ).os_)->stream_);
  return true;
}

Assistant:

bool StartObject() {
        PrettyPrefix(kObjectType);
        new (Base::level_stack_.template Push<typename Base::Level>()) typename Base::Level(false);
        return Base::WriteStartObject();
    }